

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3AddCheckConstraint(Parse *pParse,Expr *pCheckExpr)

{
  sqlite3 *db;
  Table *pTVar1;
  ExprList *pList;
  
  db = pParse->db;
  pTVar1 = pParse->pNewTable;
  if (((pTVar1 == (Table *)0x0) || (pParse->eParseMode == '\x01')) ||
     (((db->aDb[(db->init).iDb].pBt)->pBt->btsFlags & 1) != 0)) {
    if (pCheckExpr != (Expr *)0x0) {
      sqlite3ExprDeleteNN(db,pCheckExpr);
      return;
    }
  }
  else {
    pList = sqlite3ExprListAppend((Parse *)db,pTVar1->pCheck,pCheckExpr);
    pTVar1->pCheck = pList;
    if ((pParse->constraintName).n != 0) {
      sqlite3ExprListSetName(pParse,pList,&pParse->constraintName,1);
      return;
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddCheckConstraint(
  Parse *pParse,    /* Parsing context */
  Expr *pCheckExpr  /* The check expression */
){
#ifndef SQLITE_OMIT_CHECK
  Table *pTab = pParse->pNewTable;
  sqlite3 *db = pParse->db;
  if( pTab && !IN_DECLARE_VTAB
   && !sqlite3BtreeIsReadonly(db->aDb[db->init.iDb].pBt)
  ){
    pTab->pCheck = sqlite3ExprListAppend(pParse, pTab->pCheck, pCheckExpr);
    if( pParse->constraintName.n ){
      sqlite3ExprListSetName(pParse, pTab->pCheck, &pParse->constraintName, 1);
    }
  }else
#endif
  {
    sqlite3ExprDelete(pParse->db, pCheckExpr);
  }
}